

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O1

void __thiscall apngasm::APNGAsm::dirtyTransparencyOptimization(APNGAsm *this,uchar coltype)

{
  uchar *puVar1;
  ulong uVar2;
  pointer pAVar3;
  int iVar4;
  undefined7 in_register_00000031;
  long lVar5;
  
  iVar4 = (int)CONCAT71(in_register_00000031,coltype);
  if (iVar4 == 6) {
    pAVar3 = (this->_frames).
             super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->_frames).super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
        _M_impl.super__Vector_impl_data._M_finish != pAVar3) {
      uVar2 = 0;
      do {
        if (this->_size != 0) {
          puVar1 = pAVar3[uVar2]._pixels;
          lVar5 = 0;
          do {
            if (puVar1[lVar5 * 4 + 3] == '\0') {
              puVar1[lVar5 * 4 + 2] = '\0';
              (puVar1 + lVar5 * 4)[0] = '\0';
              (puVar1 + lVar5 * 4)[1] = '\0';
            }
            lVar5 = lVar5 + 1;
          } while ((uint)lVar5 < this->_size);
        }
        uVar2 = uVar2 + 1;
        pAVar3 = (this->_frames).
                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl
                 .super__Vector_impl_data._M_start;
      } while (uVar2 < (ulong)(((long)(this->_frames).
                                      super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3 >> 4
                               ) * -0xf4898d5f85bb395));
    }
  }
  else if ((iVar4 == 4) &&
          (pAVar3 = (this->_frames).
                    super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          (this->_frames).
          super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
          super__Vector_impl_data._M_finish != pAVar3)) {
    uVar2 = 0;
    do {
      if (this->_size != 0) {
        puVar1 = pAVar3[uVar2]._pixels;
        lVar5 = 0;
        do {
          if (puVar1[lVar5 * 2 + 1] == '\0') {
            puVar1[lVar5 * 2] = '\0';
          }
          lVar5 = lVar5 + 1;
        } while ((uint)lVar5 < this->_size);
      }
      uVar2 = uVar2 + 1;
      pAVar3 = (this->_frames).
               super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)(((long)(this->_frames).
                                    super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3 >> 4)
                            * -0xf4898d5f85bb395));
  }
  return;
}

Assistant:

void APNGAsm::dirtyTransparencyOptimization(unsigned char coltype)
  {
    if (coltype == 6)
    {
      for (size_t n = 0; n < _frames.size(); ++n)
      {
        unsigned char * sp = _frames[n]._pixels;
        for (unsigned int j=0; j<_size; j++, sp+=4)
          if (sp[3] == 0)
             sp[0] = sp[1] = sp[2] = 0;
      }
    }
    else
    if (coltype == 4)
    {
      for (size_t n = 0; n < _frames.size(); ++n)
      {
        unsigned char * sp = _frames[n]._pixels;
        for (unsigned int j=0; j<_size; j++, sp+=2)
          if (sp[1] == 0)
            sp[0] = 0;
      }
    }
  }